

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

XmlWriter * __thiscall Catch::XmlWriter::writeText(XmlWriter *this,string *text,bool indent)

{
  bool bVar1;
  ostream *os;
  XmlEncode local_50;
  
  if (text->_M_string_length != 0) {
    bVar1 = this->m_tagIsOpen;
    ensureTagClosed(this);
    if ((indent & bVar1) == 1) {
      std::operator<<((ostream *)this->m_os,(string *)&this->m_indent);
    }
    os = this->m_os;
    std::__cxx11::string::string((string *)&local_50,(string *)text);
    local_50.m_forWhat = ForTextNodes;
    XmlEncode::encodeTo(&local_50,os);
    std::__cxx11::string::~string((string *)&local_50);
    this->m_needsNewline = true;
  }
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeText( std::string const& text, bool indent ) {
        if( !text.empty() ){
            bool tagWasOpen = m_tagIsOpen;
            ensureTagClosed();
            if( tagWasOpen && indent )
                m_os << m_indent;
            m_os << XmlEncode( text );
            m_needsNewline = true;
        }
        return *this;
    }